

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

void Aig_ObjPrintVerilog(FILE *pFile,Aig_Obj_t *pObj,Vec_Vec_t *vLevels,int Level)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  undefined8 *puVar5;
  long lVar6;
  Aig_Obj_t *pAVar7;
  char *pcVar8;
  uint uVar9;
  char *__s;
  int iVar10;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  Aig_Obj_t *local_40;
  Aig_Obj_t *local_38;
  
  uVar9 = (uint)pObj;
  pAVar7 = (Aig_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  uVar1 = (uint)*(undefined8 *)&pAVar7->field_0x18 & 7;
  if (uVar1 == 6) {
    iVar2 = Level + 1;
    if (vLevels->nSize <= Level) {
      if (vLevels->nCap <= Level) {
        if (vLevels->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((long)iVar2 << 3);
        }
        else {
          ppvVar3 = (void **)realloc(vLevels->pArray,(long)iVar2 << 3);
        }
        vLevels->pArray = ppvVar3;
        vLevels->nCap = iVar2;
      }
      iVar10 = vLevels->nSize;
      lVar6 = (long)iVar10;
      if (iVar10 <= Level) {
        iVar10 = (Level - iVar10) + 1;
        do {
          puVar5 = (undefined8 *)malloc(0x10);
          *puVar5 = 0;
          puVar5[1] = 0;
          vLevels->pArray[lVar6] = puVar5;
          lVar6 = lVar6 + 1;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      vLevels->nSize = iVar2;
    }
    if ((Level < 0) || (vLevels->nSize <= Level)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                    ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
    }
    pVVar4 = (Vec_Ptr_t *)vLevels->pArray[(uint)Level];
    Aig_ObjCollectMulti(pAVar7,pVVar4);
    pcVar8 = "(";
    if (Level == 0) {
      pcVar8 = "";
    }
    fputs(pcVar8,(FILE *)pFile);
    if (0 < pVVar4->nSize) {
      lVar6 = 0;
      do {
        Aig_ObjPrintVerilog(pFile,(Aig_Obj_t *)
                                  ((ulong)(lVar6 == 0 & (byte)(uVar9 & 1)) ^
                                  (ulong)pVVar4->pArray[lVar6]),vLevels,iVar2);
        if (lVar6 < (long)pVVar4->nSize + -1) {
          fwrite(" ^ ",3,1,(FILE *)pFile);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar4->nSize);
    }
  }
  else {
    if (uVar1 == 2) {
      pcVar8 = "~";
      if (((ulong)pObj & 1) == 0) {
        pcVar8 = "";
      }
      fprintf((FILE *)pFile,"%s%s",pcVar8,(pAVar7->field_5).pData);
      return;
    }
    if (uVar1 == 1) {
      fprintf((FILE *)pFile,"1\'b%d",(ulong)(uVar9 & 1 ^ 1));
      return;
    }
    iVar2 = Aig_ObjIsMuxType(pAVar7);
    if (iVar2 != 0) {
      iVar2 = Aig_ObjRecognizeExor(pAVar7,&local_38,&local_40);
      if (iVar2 == 0) {
        pAVar7 = Aig_ObjRecognizeMux(pAVar7,&local_40,&local_38);
        pcVar8 = "(";
        if (Level == 0) {
          pcVar8 = "";
        }
        __s = ")";
        if (Level == 0) {
          __s = "";
        }
        fputs(pcVar8,(FILE *)pFile);
        iVar2 = Level + 1;
        Aig_ObjPrintVerilog(pFile,pAVar7,vLevels,iVar2);
        fwrite(" ? ",3,1,(FILE *)pFile);
        Aig_ObjPrintVerilog(pFile,(Aig_Obj_t *)((ulong)local_40 ^ (ulong)(uVar9 & 1)),vLevels,iVar2)
        ;
        fwrite(" : ",3,1,(FILE *)pFile);
        Aig_ObjPrintVerilog(pFile,(Aig_Obj_t *)((ulong)(uVar9 & 1) ^ (ulong)local_38),vLevels,iVar2)
        ;
      }
      else {
        pcVar8 = "(";
        if (Level == 0) {
          pcVar8 = "";
        }
        __s = ")";
        if (Level == 0) {
          __s = "";
        }
        fputs(pcVar8,(FILE *)pFile);
        Aig_ObjPrintVerilog(pFile,(Aig_Obj_t *)((ulong)(uVar9 & 1) ^ (ulong)local_38),vLevels,
                            Level + 1);
        fwrite(" ^ ",3,1,(FILE *)pFile);
        Aig_ObjPrintVerilog(pFile,local_40,vLevels,Level + 1);
      }
      goto LAB_006d3868;
    }
    Vec_VecExpand(vLevels,Level);
    pVVar4 = Vec_VecEntry(vLevels,Level);
    Aig_ObjCollectMulti(pAVar7,pVVar4);
    pcVar8 = "(";
    if (Level == 0) {
      pcVar8 = "";
    }
    fputs(pcVar8,(FILE *)pFile);
    if (0 < pVVar4->nSize) {
      pcVar8 = "|";
      if (((ulong)pObj & 1) == 0) {
        pcVar8 = "&";
      }
      lVar6 = 0;
      do {
        Aig_ObjPrintVerilog(pFile,(Aig_Obj_t *)((ulong)pVVar4->pArray[lVar6] ^ (ulong)(uVar9 & 1)),
                            vLevels,Level + 1);
        if (lVar6 < (long)pVVar4->nSize + -1) {
          fprintf((FILE *)pFile," %s ",pcVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar4->nSize);
    }
  }
  __s = ")";
  if (Level == 0) {
    __s = "";
  }
LAB_006d3868:
  fputs(__s,(FILE *)pFile);
  return;
}

Assistant:

void Aig_ObjPrintVerilog( FILE * pFile, Aig_Obj_t * pObj, Vec_Vec_t * vLevels, int Level )
{
    Vec_Ptr_t * vSuper;
    Aig_Obj_t * pFanin, * pFanin0, * pFanin1, * pFaninC;
    int fCompl, i;
    // store the complemented attribute
    fCompl = Aig_IsComplement(pObj);
    pObj = Aig_Regular(pObj);
    // constant case
    if ( Aig_ObjIsConst1(pObj) )
    {
        fprintf( pFile, "1\'b%d", !fCompl );
        return;
    }
    // PI case
    if ( Aig_ObjIsCi(pObj) )
    {
        fprintf( pFile, "%s%s", fCompl? "~" : "", (char*)pObj->pData );
        return;
    }
    // EXOR case
    if ( Aig_ObjIsExor(pObj) )
    {
        Vec_VecExpand( vLevels, Level );
        vSuper = Vec_VecEntry( vLevels, Level );
        Aig_ObjCollectMulti( pObj, vSuper );
        fprintf( pFile, "%s", (Level==0? "" : "(") );
        Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
        {
            Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin, (fCompl && i==0)), vLevels, Level+1 );
            if ( i < Vec_PtrSize(vSuper) - 1 )
                fprintf( pFile, " ^ " );
        }
        fprintf( pFile, "%s", (Level==0? "" : ")") );
        return;
    }
    // MUX case
    if ( Aig_ObjIsMuxType(pObj) )
    {
        if ( Aig_ObjRecognizeExor( pObj, &pFanin0, &pFanin1 ) )
        {
            fprintf( pFile, "%s", (Level==0? "" : "(") );
            Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin0, fCompl), vLevels, Level+1 );
            fprintf( pFile, " ^ " );
            Aig_ObjPrintVerilog( pFile, pFanin1, vLevels, Level+1 );
            fprintf( pFile, "%s", (Level==0? "" : ")") );
        }
        else 
        {
            pFaninC = Aig_ObjRecognizeMux( pObj, &pFanin1, &pFanin0 );
            fprintf( pFile, "%s", (Level==0? "" : "(") );
            Aig_ObjPrintVerilog( pFile, pFaninC, vLevels, Level+1 );
            fprintf( pFile, " ? " );
            Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin1, fCompl), vLevels, Level+1 );
            fprintf( pFile, " : " );
            Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin0, fCompl), vLevels, Level+1 );
            fprintf( pFile, "%s", (Level==0? "" : ")") );
        }
        return;
    }
    // AND case
    Vec_VecExpand( vLevels, Level );
    vSuper = Vec_VecEntry(vLevels, Level);
    Aig_ObjCollectMulti( pObj, vSuper );
    fprintf( pFile, "%s", (Level==0? "" : "(") );
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
    {
        Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin, fCompl), vLevels, Level+1 );
        if ( i < Vec_PtrSize(vSuper) - 1 )
            fprintf( pFile, " %s ", fCompl? "|" : "&" );
    }
    fprintf( pFile, "%s", (Level==0? "" : ")") );
    return;
}